

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPSources::GetRTCPSourceData
          (RTPSources *this,uint32_t ssrc,RTPAddress *senderaddress,RTPInternalSourceData **srcdat2,
          bool *newsource)

{
  RTPAddress *pRVar1;
  RTPMemoryManager *pRVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  bool created;
  RTPInternalSourceData *srcdat;
  bool local_41;
  bool *local_40;
  RTPInternalSourceData *local_38;
  
  *srcdat2 = (RTPInternalSourceData *)0x0;
  iVar4 = ObtainSourceDataInstance(this,ssrc,&local_38,&local_41);
  if (-1 < iVar4) {
    local_40 = newsource;
    if (local_41 == true) {
      if (senderaddress == (RTPAddress *)0x0) {
        pRVar1 = (local_38->super_RTPSourceData).rtcpaddr;
        if (pRVar1 != (RTPAddress *)0x0) {
          pRVar2 = (local_38->super_RTPSourceData).super_RTPMemoryObject.mgr;
          if (pRVar2 == (RTPMemoryManager *)0x0) {
            (*pRVar1->_vptr_RTPAddress[4])(pRVar1);
          }
          else {
            (*pRVar1->_vptr_RTPAddress[3])(pRVar1);
            (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,pRVar1);
          }
          (local_38->super_RTPSourceData).rtcpaddr = (RTPAddress *)0x0;
        }
      }
      else {
        iVar4 = (**senderaddress->_vptr_RTPAddress)
                          (senderaddress,(local_38->super_RTPSourceData).super_RTPMemoryObject.mgr);
        if ((RTPAddress *)CONCAT44(extraout_var,iVar4) == (RTPAddress *)0x0) {
          return -1;
        }
        pRVar1 = (local_38->super_RTPSourceData).rtcpaddr;
        if (pRVar1 != senderaddress && pRVar1 != (RTPAddress *)0x0) {
          pRVar2 = (local_38->super_RTPSourceData).super_RTPMemoryObject.mgr;
          if (pRVar2 == (RTPMemoryManager *)0x0) {
            (*pRVar1->_vptr_RTPAddress[4])(pRVar1);
          }
          else {
            (*pRVar1->_vptr_RTPAddress[3])(pRVar1);
            (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,pRVar1);
          }
        }
        (local_38->super_RTPSourceData).rtcpaddr = (RTPAddress *)CONCAT44(extraout_var,iVar4);
      }
      (local_38->super_RTPSourceData).isrtcpaddrset = true;
    }
    else {
      bVar3 = CheckCollision(this,local_38,senderaddress,false);
      if (bVar3) {
        return 0;
      }
    }
    *srcdat2 = local_38;
    *local_40 = local_41;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int RTPSources::GetRTCPSourceData(uint32_t ssrc,const RTPAddress *senderaddress,
		                  RTPInternalSourceData **srcdat2,bool *newsource)
{
	int status;
	bool created;
	RTPInternalSourceData *srcdat;
	
	*srcdat2 = 0;
	
	if ((status = ObtainSourceDataInstance(ssrc,&srcdat,&created)) < 0)
		return status;
	
	if (created)
	{
		if ((status = srcdat->SetRTCPDataAddress(senderaddress)) < 0)
			return status;
	}
	else // got a previously existing source
	{
		if (CheckCollision(srcdat,senderaddress,false))
			return 0; // ignore packet on collision
	}
	
	*srcdat2 = srcdat;
	*newsource = created;

	return 0;
}